

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O3

TokenPtr __thiscall Assimp::FBX::Parser::AdvanceToNextToken(Parser *this)

{
  pointer ppTVar1;
  TokenPtr pTVar2;
  
  this->last = this->current;
  ppTVar1 = (this->cursor)._M_current;
  if (ppTVar1 ==
      (this->tokens->
      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    pTVar2 = (TokenPtr)0x0;
  }
  else {
    (this->cursor)._M_current = ppTVar1 + 1;
    pTVar2 = *ppTVar1;
  }
  this->current = pTVar2;
  return pTVar2;
}

Assistant:

TokenPtr Parser::AdvanceToNextToken()
{
    last = current;
    if (cursor == tokens.end()) {
        current = NULL;
    } else {
        current = *cursor++;
    }
    return current;
}